

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void cpu_mips_realize_env_mips64(CPUMIPSState_conflict5 *env)

{
  mips_mmu_types mVar1;
  mips_def_t_conflict *pmVar2;
  CPUMIPSTLBContext_conflict1 *pCVar3;
  CPUMIPSMVPContext *pCVar4;
  code *pcVar5;
  long lVar6;
  CPUMIPSState_conflict5 *__mptr;
  
  env->exception_base = 0xffffffffbfc00000;
  pmVar2 = env->cpu_model;
  pCVar3 = (CPUMIPSTLBContext_conflict1 *)g_malloc0(0x1440);
  env->tlb = pCVar3;
  mVar1 = pmVar2->mmu_type;
  if (mVar1 == MMU_TYPE_FMT) {
    pCVar3->nb_tlb = 1;
    pcVar5 = fixed_mmu_map_address_mips64;
  }
  else {
    if (mVar1 == MMU_TYPE_R4000) {
      pCVar3->nb_tlb = ((uint)pmVar2->CP0_Config1 >> 0x19 & 0x3f) + 1;
      pCVar3->map_address = r4k_map_address_mips64;
      pCVar3->helper_tlbwi_mips64 = r4k_helper_tlbwi_mips64;
      pCVar3->helper_tlbwr_mips64 = r4k_helper_tlbwr_mips64;
      pCVar3->helper_tlbp_mips64 = r4k_helper_tlbp_mips64;
      pCVar3->helper_tlbr_mips64 = r4k_helper_tlbr_mips64;
      pCVar3->helper_tlbinv_mips64 = r4k_helper_tlbinv_mips64;
      pcVar5 = r4k_helper_tlbinvf_mips64;
      lVar6 = 0x38;
      goto LAB_008d7c9f;
    }
    if (mVar1 != MMU_TYPE_NONE) {
      cpu_abort_mips64((CPUState *)(env[-3].tcs[0xc].gpr + 0x12),"MMU type not supported\n");
    }
    pCVar3->nb_tlb = 1;
    pcVar5 = no_mmu_map_address_mips64;
  }
  lVar6 = 8;
LAB_008d7c9f:
  *(code **)((long)&pCVar3->nb_tlb + lVar6) = pcVar5;
  env->fpus[0].fcr0 = env->cpu_model->CP1_fcr0;
  memcpy(&env->active_fpu,env->fpus,0x218);
  pCVar4 = (CPUMIPSMVPContext *)g_malloc0(0xc);
  env->mvp = pCVar4;
  pCVar4->CP0_MVPConf0 = -0x57ff8000;
  pCVar4->CP0_MVPConf0 = env->tlb->nb_tlb << 0x10 | 0xa8008000;
  pCVar4->CP0_MVPConf1 = -0x3fffffff;
  return;
}

Assistant:

void cpu_mips_realize_env(CPUMIPSState *env)
{
    env->exception_base = (int32_t)0xBFC00000;

    mmu_init(env, env->cpu_model);
    fpu_init(env, env->cpu_model);
    mvp_init(env, env->cpu_model);
}